

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O1

int __thiscall jpgd::jpeg_decoder::decode(jpeg_decoder *this,void **pScan_line,uint *pScan_line_len)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint32_t uVar4;
  long lVar5;
  uint8 *puVar6;
  bool bVar7;
  bool bVar8;
  
  if (this->m_error_code != JPGD_SUCCESS) {
    return -1;
  }
  if (this->m_ready_flag != true) {
    return -1;
  }
  iVar3 = this->m_total_lines_left;
  if (iVar3 == 0) {
    return 1;
  }
  bVar8 = (this->m_flags & 1) != 0;
  bVar7 = 1 < this->m_scan_type - 3U;
  if (bVar7 || bVar8) {
    bVar2 = this->m_mcu_lines_left == 0;
LAB_00150b10:
    bVar1 = false;
  }
  else {
    if (iVar3 == this->m_image_y_size) {
      bVar2 = true;
      goto LAB_00150b10;
    }
    bVar2 = 1 < iVar3 && this->m_mcu_lines_left == 1;
    bVar1 = bVar2;
  }
  if ((bVar2) && (iVar3 = decode_next_mcu_row(this), iVar3 != 0)) {
    return iVar3;
  }
  switch(this->m_scan_type) {
  case 0:
    gray_convert(this);
    break;
  case 1:
    H1V1Convert(this);
    break;
  case 2:
    if ((this->m_flags & 1) == 0) {
      H2V1ConvertFiltered(this);
    }
    else {
      H2V1Convert(this);
    }
    break;
  case 3:
    if (!bVar7 && !bVar8) {
      H1V2ConvertFiltered(this);
      break;
    }
    if ((this->m_mcu_lines_left & 1) == 0) {
      H1V2Convert(this);
      break;
    }
LAB_00150c2a:
    puVar6 = this->m_pScan_line_1;
    goto LAB_00150c02;
  case 4:
    if ((this->m_flags & 1) == 0) {
      if (this->m_num_buffered_scanlines == 1) {
        lVar5 = 0x34c0;
LAB_00150c38:
        *pScan_line = *(void **)((long)this->m_jmp_state[0].__jmpbuf + lVar5);
      }
      else if (this->m_num_buffered_scanlines == 0) {
        uVar4 = H2V2ConvertFiltered(this);
        this->m_num_buffered_scanlines = uVar4;
        lVar5 = 0x34b8;
        goto LAB_00150c38;
      }
      this->m_num_buffered_scanlines = this->m_num_buffered_scanlines + -1;
      goto switchD_00150b5a_default;
    }
    if ((this->m_mcu_lines_left & 1) != 0) goto LAB_00150c2a;
    H2V2Convert(this);
    break;
  default:
    goto switchD_00150b5a_default;
  }
  puVar6 = this->m_pScan_line_0;
LAB_00150c02:
  *pScan_line = puVar6;
switchD_00150b5a_default:
  *pScan_line_len = this->m_real_dest_bytes_per_scan_line;
  if (!bVar1) {
    this->m_mcu_lines_left = this->m_mcu_lines_left + -1;
  }
  this->m_total_lines_left = this->m_total_lines_left + -1;
  return 0;
}

Assistant:

int jpeg_decoder::decode(const void** pScan_line, uint* pScan_line_len)
	{
		if ((m_error_code) || (!m_ready_flag))
			return JPGD_FAILED;

		if (m_total_lines_left == 0)
			return JPGD_DONE;

		const bool chroma_y_filtering = ((m_flags & cFlagBoxChromaFiltering) == 0) && ((m_scan_type == JPGD_YH2V2) || (m_scan_type == JPGD_YH1V2));

		bool get_another_mcu_row = false;
		bool got_mcu_early = false;
		if (chroma_y_filtering)
		{
			if (m_total_lines_left == m_image_y_size)
				get_another_mcu_row = true;
			else if ((m_mcu_lines_left == 1) && (m_total_lines_left > 1))
			{
				get_another_mcu_row = true;
				got_mcu_early = true;
			}
		}
		else
		{
			get_another_mcu_row = (m_mcu_lines_left == 0);
		}

		if (get_another_mcu_row)
		{
			int status = decode_next_mcu_row();
			if (status != 0)
				return status;
		}

		switch (m_scan_type)
		{
		case JPGD_YH2V2:
		{
			if ((m_flags & cFlagBoxChromaFiltering) == 0)
			{
				if (m_num_buffered_scanlines == 1)
				{
					*pScan_line = m_pScan_line_1;
				}
				else if (m_num_buffered_scanlines == 0)
				{
					m_num_buffered_scanlines = H2V2ConvertFiltered();
					*pScan_line = m_pScan_line_0;
				}

				m_num_buffered_scanlines--;
			}
			else
			{
				if ((m_mcu_lines_left & 1) == 0)
				{
					H2V2Convert();
					*pScan_line = m_pScan_line_0;
				}
				else
					*pScan_line = m_pScan_line_1;
			}

			break;
		}
		case JPGD_YH2V1:
		{
			if ((m_flags & cFlagBoxChromaFiltering) == 0)
				H2V1ConvertFiltered();
			else
				H2V1Convert();
			*pScan_line = m_pScan_line_0;
			break;
		}
		case JPGD_YH1V2:
		{
			if (chroma_y_filtering)
			{
				H1V2ConvertFiltered();
				*pScan_line = m_pScan_line_0;
			}
			else
			{
				if ((m_mcu_lines_left & 1) == 0)
				{
					H1V2Convert();
					*pScan_line = m_pScan_line_0;
				}
				else
					*pScan_line = m_pScan_line_1;
			}

			break;
		}
		case JPGD_YH1V1:
		{
			H1V1Convert();
			*pScan_line = m_pScan_line_0;
			break;
		}
		case JPGD_GRAYSCALE:
		{
			gray_convert();
			*pScan_line = m_pScan_line_0;

			break;
		}
		}

		*pScan_line_len = m_real_dest_bytes_per_scan_line;

		if (!got_mcu_early)
		{
			m_mcu_lines_left--;
		}

		m_total_lines_left--;

		return JPGD_SUCCESS;
	}